

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageQueue.cpp
# Opt level: O0

void __thiscall f8n::runtime::MessageQueue::Unregister(MessageQueue *this,IMessageTarget *target)

{
  bool bVar1;
  _Self local_50 [3];
  _Self local_38;
  undefined1 local_30 [8];
  LockT lock;
  IMessageTarget *pIStack_18;
  bool shouldRemove;
  IMessageTarget *target_local;
  MessageQueue *this_local;
  
  lock._15_1_ = 0;
  pIStack_18 = target;
  target_local = (IMessageTarget *)this;
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_30,&this->queueMutex);
  local_38._M_node =
       (_Base_ptr)
       std::
       set<f8n::runtime::IMessageTarget_*,_std::less<f8n::runtime::IMessageTarget_*>,_std::allocator<f8n::runtime::IMessageTarget_*>_>
       ::find(&this->targets,&stack0xffffffffffffffe8);
  local_50[0]._M_node =
       (_Base_ptr)
       std::
       set<f8n::runtime::IMessageTarget_*,_std::less<f8n::runtime::IMessageTarget_*>,_std::allocator<f8n::runtime::IMessageTarget_*>_>
       ::end(&this->targets);
  bVar1 = std::operator!=(&local_38,local_50);
  if (bVar1) {
    std::
    set<f8n::runtime::IMessageTarget_*,_std::less<f8n::runtime::IMessageTarget_*>,_std::allocator<f8n::runtime::IMessageTarget_*>_>
    ::erase(&this->targets,&stack0xffffffffffffffe8);
    lock._15_1_ = 1;
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_30);
  if ((lock._15_1_ & 1) != 0) {
    (*(this->super_IMessageQueue)._vptr_IMessageQueue[3])(this,pIStack_18,0xffffffff);
  }
  return;
}

Assistant:

void MessageQueue::Unregister(IMessageTarget* target) {
    bool shouldRemove = false;
    {
        LockT lock(this->queueMutex);
        if (this->targets.find(target) != this->targets.end()) {
            this->targets.erase(target);
            shouldRemove = true;
        }
    }
    if (shouldRemove) {
        this->Remove(target);
    }
}